

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void * mwCalloc(size_t a,size_t b,char *file,int line)

{
  void *pvVar1;
  
  pvVar1 = mwMalloc(a * b,file,line);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memset(pvVar1,0,a * b);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void *mwCalloc(size_t a, size_t b, const char *file, int line)
{
	void *p;
	size_t size = a * b;
	p = mwMalloc(size, file, line);
	if (p == NULL) {
		return NULL;
	}
	memset(p, 0, size);
	return p;
}